

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

void __thiscall
lumeview::Renderer::add_stage
          (Renderer *this,string *name,SPMesh *mesh,GrobSet grobSet,ShadingPreset shading)

{
  int iVar1;
  element_type *peVar2;
  _Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_> _Var3;
  bool bVar4;
  uint uVar5;
  string *psVar6;
  ostream *poVar7;
  LumeviewError *pLVar8;
  stringstream ss;
  string sStack_278;
  Stage local_258;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  bVar4 = lume::Mesh::has((mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                          grobSet);
  if (!bVar4) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Requested grob type \'",0x15);
    psVar6 = lume::GrobSetName_abi_cxx11_
                       (*(grob_set_t *)(lume::impl::GROB_SET_DESCS + (ulong)grobSet.m_offset * 4));
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\' is not provided by the specified mesh.",0x28);
    pLVar8 = (LumeviewError *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    LumeviewError::LumeviewError(pLVar8,&local_258.name);
    __cxa_throw(pLVar8,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
  }
  Stage::Stage(&local_258);
  local_258.mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_258.mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  iVar1 = *(int *)(lume::impl::GROB_SET_DESCS + (ulong)grobSet.m_offset * 4);
  if (1 < iVar1 - 2U) {
    if (iVar1 == 1) {
      local_258.primType = 1;
      local_258.color.field_0._0_8_ = 0x3e4ccccd3e4ccccd;
      local_258.color.field_0._8_8_ = 0x3f0000003f800000;
      local_258.zfacNear = 0.99;
      local_258.zfacFar = 1.0;
      _Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl =
           ((mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_grobArrays
           [1]._M_t.super___uniq_ptr_impl<lume::GrobArray,_std::default_delete<lume::GrobArray>_>.
           _M_t.super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>.
           super__Head_base<0UL,_lume::GrobArray_*,_false>;
      if (_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl == (GrobArray *)0x0) {
        local_258.numInds = 0;
      }
      else {
        local_258.numInds =
             (GLsizei)((ulong)(*(long *)((long)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>
                                               ._M_head_impl + 0x18) -
                              *(long *)((long)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>.
                                              _M_head_impl + 0x10)) >> 2);
        local_258.color.field_0._0_8_ = 0x3e4ccccd3e4ccccd;
        local_258.color.field_0._8_8_ = 0x3f0000003f800000;
      }
      goto LAB_0013adbb;
    }
    if (iVar1 != 9) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Renderer::add_stage: Unsupported grid object type in specified mesh.",
                 0x44);
      pLVar8 = (LumeviewError *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      LumeviewError::LumeviewError(pLVar8,&sStack_278);
      __cxa_throw(pLVar8,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
    }
  }
  local_258.primType = 4;
  local_258.color.field_0._0_8_ = 0x3f8000003f800000;
  local_258.color.field_0._8_8_ = 0x3f8000003f800000;
  local_258.zfacNear = 1.0;
  local_258.zfacFar = 1.0;
  peVar2 = (mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  _Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl =
       peVar2->m_grobArrays[2]._M_t.
       super___uniq_ptr_impl<lume::GrobArray,_std::default_delete<lume::GrobArray>_>._M_t.
       super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>.
       super__Head_base<0UL,_lume::GrobArray_*,_false>;
  uVar5 = 0;
  local_258.numInds = 0;
  if (_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl != (GrobArray *)0x0) {
    local_258.numInds =
         (GLsizei)((ulong)(*(long *)((long)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>.
                                           _M_head_impl + 0x18) -
                          *(long *)((long)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>.
                                          _M_head_impl + 0x10)) >> 2);
  }
  _Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl =
       peVar2->m_grobArrays[3]._M_t.
       super___uniq_ptr_impl<lume::GrobArray,_std::default_delete<lume::GrobArray>_>._M_t.
       super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>.
       super__Head_base<0UL,_lume::GrobArray_*,_false>;
  if (_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl != (GrobArray *)0x0) {
    uVar5 = (uint)((int)((ulong)(*(long *)((long)_Var3.
                                                 super__Head_base<0UL,_lume::GrobArray_*,_false>.
                                                 _M_head_impl + 0x18) -
                                *(long *)((long)_Var3.
                                                super__Head_base<0UL,_lume::GrobArray_*,_false>.
                                                _M_head_impl + 0x10)) >> 2) * 3) >> 1;
  }
  local_258.numInds = uVar5 + local_258.numInds;
LAB_0013adbb:
  local_258.shadingPreset = shading;
  std::__cxx11::string::operator=((string *)&local_258,(string *)name);
  local_258.grobSet.m_offset = grobSet.m_offset;
  std::vector<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>::
  emplace_back<lumeview::Renderer::Stage>(&this->m_stages,&local_258);
  Stage::~Stage(&local_258);
  return;
}

Assistant:

void Renderer::
add_stage (	std::string name,
            SPMesh mesh,
            const GrobSet grobSet,
            ShadingPreset shading)
{
	COND_THROW (!mesh->has (grobSet),
	            "Requested grob type '" << grobSet.name()
	            << "' is not provided by the specified mesh.");

	Stage newStage;
	newStage.mesh = mesh;

	switch (grobSet.type()) {
		case EDGES:
			newStage.primType = GL_LINES;
			newStage.color = glm::vec4 (0.2f, 0.2f, 1.0f, 0.5f);
			newStage.zfacNear = 0.99f;
			newStage.zfacFar = 1.f;
			newStage.numInds = mesh->num_indices (EDGE);
			break;
		
		case TRIS:
		case QUADS:
		case FACES:
			newStage.primType = GL_TRIANGLES;
			newStage.color = glm::vec4 (1.0f, 1.0f, 1.0f, 1.0f);
			newStage.zfacNear = 1.0f;
			newStage.zfacFar = 1.0f;
			newStage.numInds = mesh->num_indices(TRI)
					 		 + 3 * mesh->num_indices(QUAD) / 2;
			break;
		default:
			THROW("Renderer::add_stage: Unsupported grid object type in specified mesh.");
	}

	newStage.shadingPreset = shading;
	newStage.name = std::move (name);
	newStage.grobSet = grobSet;
	m_stages.push_back (std::move(newStage));
}